

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
       *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  bool bVar1;
  intptr_t iVar2;
  char *end_00;
  size_t sVar3;
  char *pcVar4;
  long in_RCX;
  BoyerMooreTextState *in_RDX;
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *in_RSI;
  BoyerMooreTextState *in_RDI;
  long in_R8;
  Result RVar5;
  size_t binOffset;
  BoyerMooreTextAccessor accessor;
  size_t i;
  size_t fullLength;
  size_t dstLength;
  size_t srcLength;
  char *p2;
  Result convertResult;
  utf32_t buffer [256];
  DecoderState decoderState;
  char *end;
  PtrIterator<const_char,_true> p;
  BoyerMooreTextState *in_stack_fffffffffffffaf8;
  DecoderState in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  DecoderState *in_stack_fffffffffffffb18;
  utf32_t replacement;
  SrcUnit *in_stack_fffffffffffffb20;
  SrcUnit *in_stack_fffffffffffffb28;
  BoyerMooreTextAccessor *accessor_00;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *this_00;
  DecoderState *in_stack_fffffffffffffb40;
  BoyerMooreTextState *this_01;
  PtrIterator<const_char,_true> in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb70;
  DecoderState in_stack_fffffffffffffb78;
  BoyerMooreTextState *p_00;
  char *local_450;
  BoyerMooreTextAccessor local_448 [64];
  undefined1 auStack_48 [8];
  Hdr *local_40;
  char *local_38;
  PtrIterator<const_char,_true> local_30 [4];
  BoyerMooreTextState *local_10;
  
  this_01 = in_RDI;
  local_10 = in_RDX;
  PtrIterator<const_char,_true>::PtrIterator(local_30,(char *)(in_RCX + in_R8 + -1));
  local_40 = (Hdr *)PtrIterator<const_char,_true>::operator+
                              ((PtrIterator<const_char,_true> *)in_stack_fffffffffffffaf8,0x122e6c);
  local_38 = PtrIterator::operator_cast_to_char_((PtrIterator *)&local_40);
  auStack_48._4_4_ = BoyerMooreTextState::getDecoderState(local_10);
  while( true ) {
    replacement = (utf32_t)((ulong)in_stack_fffffffffffffb18 >> 0x20);
    bVar1 = PtrIterator<const_char,_true>::operator<(local_30,local_38);
    if (!bVar1) {
      BoyerMooreTextFindResult::BoyerMooreTextFindResult((BoyerMooreTextFindResult *)in_RDI);
      return (BoyerMooreTextFindResult *)this_01;
    }
    accessor_00 = local_448;
    this_00 = (BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
               *)auStack_48;
    PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
    RVar5 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8ReverseDecoder>
            ::convert(in_stack_fffffffffffffb40,(DstUnit *)this_00,(DstUnit *)accessor_00,
                      in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,replacement);
    local_450 = RVar5.m_src;
    iVar2 = PtrIterator<const_char,_true>::operator-
                      ((PtrIterator<const_char,_true> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       (char *)in_stack_fffffffffffffaf8);
    p_00 = (BoyerMooreTextState *)-iVar2;
    end_00 = (char *)((long)RVar5.m_dst - (long)local_448 >> 2);
    sVar3 = BoyerMooreStateBase<wchar_t>::getTailLength((BoyerMooreStateBase<wchar_t> *)0x122f83);
    pcVar4 = end_00 + sVar3;
    BoyerMooreTextAccessor::BoyerMooreTextAccessor
              ((BoyerMooreTextAccessor *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(utf32_t *)0x122fad);
    in_stack_fffffffffffffb18 =
         (DecoderState *)
         BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
         ::findImpl<axl::sl::BoyerMooreTextAccessor>
                   (this_00,accessor_00,(size_t)in_stack_fffffffffffffb28,
                    (size_t)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb40 = in_stack_fffffffffffffb18;
    sVar3 = ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount(in_RSI);
    if ((char *)((long)in_stack_fffffffffffffb40 + sVar3) <= pcVar4) break;
    PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
    in_stack_fffffffffffffaf8 = p_00;
    locateBinOffset((BoyerMooreTextState *)RVar5.m_dst,(size_t)local_450,(char *)p_00,end_00);
    in_stack_fffffffffffffb00 = auStack_48._4_4_;
    BoyerMooreTextState::advance<true>
              ((BoyerMooreTextState *)in_stack_fffffffffffffb60.m_p,(size_t)in_RSI,
               (utf32_t *)this_01,(size_t)in_RDI,(size_t)in_stack_fffffffffffffb40,this_00,
               in_stack_fffffffffffffb70,in_stack_fffffffffffffb78);
    PtrIterator<const_char,_true>::PtrIterator
              ((PtrIterator<const_char,_true> *)&stack0xfffffffffffffb60,local_450);
  }
  PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
  createFindResult((BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                    *)this_01,in_RDI,(size_t)in_stack_fffffffffffffb40,(char *)this_00,
                   (char *)accessor_00);
  return (BoyerMooreTextFindResult *)this_01;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}